

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FieldDescriptor::legacy_enum_field_treated_as_closed(FieldDescriptor *this)

{
  MessageLite *pMVar1;
  EnumDescriptor *pEVar2;
  bool bVar3;
  
  if (this->type_ == '\x0e') {
    pMVar1 = protobuf::internal::ExtensionSet::GetMessage
                       (&(this->merged_features_->field_0)._impl_._extensions_,pb::cpp,
                        (MessageLite *)PTR__CppFeatures_default_instance__019e91e0);
    bVar3 = true;
    if (*(char *)((long)&pMVar1[1]._internal_metadata_.ptr_ + 4) == '\0') {
      pEVar2 = enum_type(this);
      bVar3 = (pEVar2->merged_features_->field_0)._impl_.enum_type_ == 2;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool FieldDescriptor::legacy_enum_field_treated_as_closed() const {
  return type() == TYPE_ENUM &&
         (features().GetExtension(pb::cpp).legacy_closed_enum() ||
          enum_type()->is_closed());
}